

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O3

Expression *
slang::ast::TimeLiteral::fromSyntax(ASTContext *context,LiteralExpressionSyntax *syntax)

{
  Compilation *this;
  NumericTokenFlags NVar1;
  optional<slang::TimeScale> oVar2;
  Type *args;
  TimeLiteral *pTVar3;
  double value;
  TimeScale scale;
  _Storage<slang::TimeScale,_true> local_44;
  double local_40;
  SourceRange local_38;
  
  value = parsing::Token::realValue(&syntax->literal);
  NVar1 = parsing::Token::numericFlags(&syntax->literal);
  oVar2 = Scope::getTimeScale((context->scope).ptr);
  local_44 = (_Storage<slang::TimeScale,_true>)0x1030103;
  if (((uint5)oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale> & 0x100000000) != 0) {
    local_44 = oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
               super__Optional_payload_base<slang::TimeScale>._M_payload;
  }
  local_40 = TimeScale::apply(&local_44._M_value,value,NVar1.raw >> 3 & (Picoseconds|Nanoseconds),
                              false);
  this = ((context->scope).ptr)->compilation;
  args = Compilation::getType(this,RealTimeType);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pTVar3 = BumpAllocator::
           emplace<slang::ast::TimeLiteral,slang::ast::Type_const&,double&,slang::SourceRange>
                     (&this->super_BumpAllocator,args,&local_40,&local_38);
  return &pTVar3->super_Expression;
}

Assistant:

Expression& TimeLiteral::fromSyntax(const ASTContext& context,
                                    const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::TimeLiteralExpression);

    // The provided value needs to be scaled to the current scope's time units
    // and then rounded to the current scope's time precision.
    double value = syntax.literal.realValue();
    TimeUnit unit = syntax.literal.numericFlags().unit();
    TimeScale scale = context.scope->getTimeScale().value_or(TimeScale());
    value = scale.apply(value, unit, /* roundToPrecision */ false);

    auto& comp = context.getCompilation();
    return *comp.emplace<TimeLiteral>(comp.getType(SyntaxKind::RealTimeType), value,
                                      syntax.sourceRange());
}